

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calendar.cpp
# Opt level: O2

double __thiscall icu_63::Calendar::computeMillisInDay(Calendar *this)

{
  int iVar1;
  int iVar2;
  int iVar3;
  double dVar4;
  
  iVar1 = this->fStamp[0xb];
  iVar2 = this->fStamp[9];
  if (this->fStamp[9] < this->fStamp[10]) {
    iVar2 = this->fStamp[10];
  }
  iVar3 = iVar1;
  if (iVar1 < iVar2) {
    iVar3 = iVar2;
  }
  if (iVar3 == 0) {
    dVar4 = 0.0;
  }
  else if (iVar1 < iVar2) {
    dVar4 = (double)(this->fFields[9] * 0xc) + (double)this->fFields[10];
  }
  else {
    dVar4 = (double)this->fFields[0xb];
  }
  return (double)this->fFields[0xe] +
         ((double)this->fFields[0xd] + ((double)this->fFields[0xc] + dVar4 * 60.0) * 60.0) * 1000.0;
}

Assistant:

double Calendar::computeMillisInDay() {
  // Do the time portion of the conversion.

    double millisInDay = 0;

    // Find the best set of fields specifying the time of day.  There
    // are only two possibilities here; the HOUR_OF_DAY or the
    // AM_PM and the HOUR.
    int32_t hourOfDayStamp = fStamp[UCAL_HOUR_OF_DAY];
    int32_t hourStamp = (fStamp[UCAL_HOUR] > fStamp[UCAL_AM_PM])?fStamp[UCAL_HOUR]:fStamp[UCAL_AM_PM];
    int32_t bestStamp = (hourStamp > hourOfDayStamp) ? hourStamp : hourOfDayStamp;

    // Hours
    if (bestStamp != kUnset) {
        if (bestStamp == hourOfDayStamp) {
            // Don't normalize here; let overflow bump into the next period.
            // This is consistent with how we handle other fields.
            millisInDay += internalGet(UCAL_HOUR_OF_DAY);
        } else {
            // Don't normalize here; let overflow bump into the next period.
            // This is consistent with how we handle other fields.
            millisInDay += internalGet(UCAL_HOUR);
            millisInDay += 12 * internalGet(UCAL_AM_PM); // Default works for unset AM_PM
        }
    }

    // We use the fact that unset == 0; we start with millisInDay
    // == HOUR_OF_DAY.
    millisInDay *= 60;
    millisInDay += internalGet(UCAL_MINUTE); // now have minutes
    millisInDay *= 60;
    millisInDay += internalGet(UCAL_SECOND); // now have seconds
    millisInDay *= 1000;
    millisInDay += internalGet(UCAL_MILLISECOND); // now have millis

    return millisInDay;
}